

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O1

int Fxch_DivRemove(Fxch_Man_t *pFxchMan,int fUpdate,int fSingleCube,int fBase)

{
  float *pfVar1;
  Vec_Que_t *p;
  uint v;
  float fVar2;
  
  v = Hsh_VecManAdd(pFxchMan->pDivHash,pFxchMan->vCubeFree);
  if (pFxchMan->vDivWeights->nSize <= (int)v) {
    __assert_fail("iDiv < Vec_FltSize( pFxchMan->vDivWeights )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchDiv.c"
                  ,0x12a,"int Fxch_DivRemove(Fxch_Man_t *, int, int, int)");
  }
  if (fSingleCube == 0) {
    if ((int)v < 0) goto LAB_004beb27;
    fVar2 = (float)(1 - (fBase + pFxchMan->vCubeFree->nSize));
  }
  else {
    if ((int)v < 0) {
LAB_004beb27:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                    ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
    }
    fVar2 = -1.0;
  }
  pfVar1 = pFxchMan->vDivWeights->pArray;
  pfVar1[v] = fVar2 + pfVar1[v];
  if ((fUpdate != 0) && (p = pFxchMan->vDivPrio, p != (Vec_Que_t *)0x0)) {
    if ((int)v < 0) {
      __assert_fail("v >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                    ,0xda,"int Vec_QueIsMember(Vec_Que_t *, int)");
    }
    if (((int)v < p->nCap) && (-1 < p->pOrder[v])) {
      Vec_QueUpdate(p,v);
    }
  }
  return v;
}

Assistant:

int Fxch_DivRemove( Fxch_Man_t* pFxchMan,
                    int fUpdate,
                    int fSingleCube,
                    int fBase )
{
    int iDiv = Hsh_VecManAdd( pFxchMan->pDivHash, pFxchMan->vCubeFree );

    assert( iDiv < Vec_FltSize( pFxchMan->vDivWeights ) );

    /* Decrement weight */
    if ( fSingleCube )
        Vec_FltAddToEntry( pFxchMan->vDivWeights, iDiv, -1 );
    else
        Vec_FltAddToEntry( pFxchMan->vDivWeights, iDiv, -( fBase + Vec_IntSize( pFxchMan->vCubeFree ) - 1 ) );

    if ( fUpdate )
        if ( pFxchMan->vDivPrio )
        {
            if ( Vec_QueIsMember( pFxchMan->vDivPrio, iDiv ) )
                Vec_QueUpdate( pFxchMan->vDivPrio, iDiv );
        }

    return iDiv;
}